

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

void * density::heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
       get_element(QueueControl *i_control)

{
  ulong uVar1;
  void *pvVar2;
  
  if ((i_control->m_next & 4) == 0) {
    uVar1 = *(ulong *)(i_control[1].m_next + 0x20);
    if ((uVar1 & uVar1 - 1) != 0) {
      density_tests::detail::assert_failed<>
                ("is_power_of_2(i_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                 ,0x10a);
    }
    pvVar2 = (void *)(-uVar1 & (long)&i_control[1].m_next + uVar1 + 7);
  }
  else {
    pvVar2 = (void *)i_control[2].m_next;
  }
  return pvVar2;
}

Assistant:

static void * get_element(detail::QueueControl * i_control) noexcept
        {
            auto result = address_add(i_control, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
            if (i_control->m_next & detail::Queue_External)
            {
                result = static_cast<ExternalBlock *>(result)->m_element;
            }
            else
            {
                result = address_upper_align(result, type_after_control(i_control)->alignment());
            }
            return result;
        }